

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O1

SRes SzDecodeCopy(UInt64 inSize,ILookInStream *inStream,Byte *outBuffer)

{
  SRes SVar1;
  SRes unaff_EBP;
  bool bVar2;
  void *inBuf;
  size_t local_40;
  void *local_38;
  
  do {
    if (inSize == 0) {
      return 0;
    }
    local_40 = 0x40000;
    if (inSize < 0x40000) {
      local_40 = inSize;
    }
    SVar1 = (*inStream->Look)(inStream,&local_38,&local_40);
    if (SVar1 == 0) {
      if (local_40 == 0) {
        SVar1 = 6;
        goto LAB_005d094f;
      }
      memcpy(outBuffer,local_38,local_40);
      outBuffer = outBuffer + local_40;
      inSize = inSize - local_40;
      SVar1 = (*inStream->Skip)(inStream,local_40);
      bVar2 = SVar1 == 0;
      if (!bVar2) {
        unaff_EBP = SVar1;
      }
    }
    else {
LAB_005d094f:
      bVar2 = false;
      unaff_EBP = SVar1;
    }
    if (!bVar2) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static SRes SzDecodeCopy(UInt64 inSize, ILookInStream *inStream, Byte *outBuffer)
{
  while (inSize > 0)
  {
    const void *inBuf;
    size_t curSize = (1 << 18);
    if (curSize > inSize)
      curSize = (size_t)inSize;
    RINOK(inStream->Look(inStream, &inBuf, &curSize));
    if (curSize == 0)
      return SZ_ERROR_INPUT_EOF;
    memcpy(outBuffer, inBuf, curSize);
    outBuffer += curSize;
    inSize -= curSize;
    RINOK(inStream->Skip((void *)inStream, curSize));
  }
  return SZ_OK;
}